

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

void __thiscall
srell::regex_internal::
re_search_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::init_for_automaton
          (re_search_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,re_state *entry,uint num_of_submatches,uint num_of_counters,uint num_of_repeats)

{
  match_flag_type mVar1;
  reference pvVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  submatch_type *br;
  uint num_of_repeats_local;
  uint num_of_counters_local;
  uint num_of_submatches_local;
  re_state *entry_local;
  re_search_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  this->entry_state_ = entry;
  std::
  vector<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize(&this->bracket,(ulong)num_of_submatches);
  simple_array<unsigned_int>::resize(&this->counter,(ulong)num_of_counters);
  std::
  vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::resize(&this->repeat,(ulong)num_of_repeats);
  mVar1 = regex_constants::operator&(this->flags_,match_continuous);
  if (mVar1 == format_default) {
    local_40 = &this->srchend;
  }
  else {
    local_40 = &this->srchbegin;
  }
  (this->nth).in_string._M_current = local_40->_M_current;
  num_of_repeats_local = num_of_submatches;
  while (1 < num_of_repeats_local) {
    num_of_repeats_local = num_of_repeats_local - 1;
    pvVar2 = std::
             vector<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::regex_internal::re_submatch_type<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->bracket,(ulong)num_of_repeats_local);
    (pvVar2->core).close_at._M_current = (this->srchend)._M_current;
    (pvVar2->core).open_at._M_current = (pvVar2->core).close_at._M_current;
    pvVar2->counter = 0;
  }
  clear_stacks(this);
  return;
}

Assistant:

void init_for_automaton
	(
		const re_state/*<charT>*/ *const entry,
		unsigned int num_of_submatches,
		const unsigned int num_of_counters,
		const unsigned int num_of_repeats
	)
	{
		entry_state_ = entry;

		bracket.resize(num_of_submatches);
		counter.resize(num_of_counters);
		repeat.resize(num_of_repeats);

		nth.in_string = (flags_ & regex_constants::match_continuous) ? srchbegin : srchend;

		while (num_of_submatches > 1)
		{
			submatch_type &br = bracket[--num_of_submatches];

			br.core.open_at = br.core.close_at = this->srchend;
			br.counter = 0;
			//  15.10.2.9; AtomEscape:
			//  If the regular expression has n or more capturing parentheses
			//  but the nth one is undefined because it hasn't captured anything,
			//  then the backreference always succeeds.

			//  C.f., table 27 and 28 on TR1, table 142 and 143 on C++11.
		}

		clear_stacks();
	}